

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void SendPeerSetupMsg(WS_ReaderInfo reader,int reversePeer,int myRank)

{
  int iVar1;
  undefined4 in_register_00000034;
  
  iVar1 = CMwrite(*(undefined8 *)
                   (CONCAT44(in_register_00000034,reversePeer) + 0x10 + (long)myRank * 0x18),
                  reader->ParentStream->CPInfo->CombinedWriterInfoFormat);
  if (iVar1 != 1) {
    CP_verbose((SstStream)reader,CriticalVerbose,
               "Message failed to send to reader peer rank %d in sendPeerSetup in reader open\n",
               (ulong)(uint)myRank);
  }
  return;
}

Assistant:

static void SendPeerSetupMsg(WS_ReaderInfo reader, int reversePeer, int myRank)
{
    CMConnection conn = reader->Connections[reversePeer].CMconn;
    SstStream Stream = reader->ParentStream;
    struct _PeerSetupMsg setup;
    memset(&setup, 0, sizeof(setup));
    setup.RS_Stream = reader->Connections[reversePeer].RemoteStreamID;
    setup.WriterRank = myRank;
    setup.WriterCohortSize = Stream->CohortSize;
    STREAM_ASSERT_UNLOCKED(Stream);
    if (CMwrite(conn, Stream->CPInfo->SharedCM->PeerSetupFormat, &setup) != 1)
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Message failed to send to reader peer rank %d in sendPeerSetup in "
                   "reader open\n",
                   reversePeer);
    }
}